

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<capnp::schema::Node::SourceInfo::Reader> * __thiscall
capnp::compiler::Compiler::getSourceInfo
          (Maybe<capnp::schema::Node::SourceInfo::Reader> *__return_storage_ptr__,Compiler *this,
          uint64_t id)

{
  SegmentReader *pSVar1;
  CapTableReader *pCVar2;
  void *pvVar3;
  WirePointer *pWVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  iterator iVar7;
  ulong local_38 [2];
  
  local_38[0] = local_38[0] & 0xffffffffffffff00;
  kj::_::Mutex::lock(&(this->impl).mutex,0,local_38);
  local_38[0] = id;
  iVar7 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_std::allocator<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(((this->impl).value.ptr)->sourceInfoById)._M_h,local_38);
  if (iVar7.
      super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_false>
      ._M_cur != (__node_type *)0x0) {
    pSVar1 = *(SegmentReader **)
              ((long)iVar7.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_false>
                     ._M_cur + 0x10);
    pCVar2 = *(CapTableReader **)
              ((long)iVar7.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_false>
                     ._M_cur + 0x18);
    pvVar3 = *(void **)((long)iVar7.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_false>
                              ._M_cur + 0x20);
    pWVar4 = *(WirePointer **)
              ((long)iVar7.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_false>
                     ._M_cur + 0x28);
    uVar5 = *(undefined8 *)
             ((long)iVar7.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_false>
                    ._M_cur + 0x30);
    uVar6 = *(undefined8 *)
             ((long)iVar7.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_false>
                    ._M_cur + 0x38);
    *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = (int)uVar5;
    *(short *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x24) = (short)((ulong)uVar5 >> 0x20);
    *(short *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x26) = (short)((ulong)uVar5 >> 0x30);
    *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value._reader.nestingLimit = uVar6;
    (__return_storage_ptr__->ptr).field_1.value._reader.data = pvVar3;
    (__return_storage_ptr__->ptr).field_1.value._reader.pointers = pWVar4;
    (__return_storage_ptr__->ptr).field_1.value._reader.segment = pSVar1;
    (__return_storage_ptr__->ptr).field_1.value._reader.capTable = pCVar2;
  }
  (__return_storage_ptr__->ptr).isSet =
       iVar7.
       super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_false>
       ._M_cur != (__node_type *)0x0;
  kj::_::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE,(Waiter *)0x0);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<schema::Node::SourceInfo::Reader> Compiler::getSourceInfo(uint64_t id) const {
  return impl.lockExclusive()->get()->getSourceInfo(id);
}